

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::StandardColumnWriter<long,_long,_duckdb::ParquetCastOperator>::FlushDictionary
          (StandardColumnWriter<long,_long,_duckdb::ParquetCastOperator> *this,
          PrimitiveColumnWriterState *state_p,ColumnWriterStatistics *stats)

{
  undefined8 __p;
  pointer *__ptr;
  undefined1 local_68 [8];
  undefined1 local_60 [16];
  code *local_50;
  code *local_48;
  double local_40;
  pointer local_38;
  ColumnWriterStatistics *local_30;
  
  local_38 = state_p[1].super_ColumnWriterState.repetition_levels.
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_40 = ((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
             bloom_filter_false_positive_ratio;
  local_30 = stats;
  make_uniq<duckdb::ParquetBloomFilter,unsigned_long,double>
            ((duckdb *)(local_68 + 8),(unsigned_long *)&local_38,&local_40);
  __p = local_60._0_8_;
  local_60._0_8_ = 0;
  std::__uniq_ptr_impl<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>_>
  ::reset((__uniq_ptr_impl<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>_>
           *)&state_p->bloom_filter,(pointer)__p);
  std::unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>_>::
  ~unique_ptr((unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>_>
               *)(local_68 + 8));
  local_48 = std::
             _Function_handler<void_(const_long_&,_const_long_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/extension/parquet/include/writer/templated_column_writer.hpp:290:34)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(const_long_&,_const_long_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/extension/parquet/include/writer/templated_column_writer.hpp:290:34)>
             ::_M_manager;
  local_60._0_8_ = &local_30;
  local_60._8_8_ = state_p;
  PrimitiveDictionary<long,_long,_duckdb::ParquetCastOperator>::IterateValues<long,_0>
            ((PrimitiveDictionary<long,_long,_duckdb::ParquetCastOperator> *)
             &state_p[1].super_ColumnWriterState.definition_levels.
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (function<void_(const_long_&,_const_long_&)> *)(local_68 + 8));
  std::_Function_base::~_Function_base((_Function_base *)(local_68 + 8));
  PrimitiveDictionary<long,_long,_duckdb::ParquetCastOperator>::GetTargetMemoryStream
            ((PrimitiveDictionary<long,_long,_duckdb::ParquetCastOperator> *)local_68);
  PrimitiveColumnWriter::WriteDictionary
            (&this->super_PrimitiveColumnWriter,state_p,
             (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *)
             local_68,(idx_t)state_p[1].super_ColumnWriterState.repetition_levels.
                             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
  if ((__uniq_ptr_data<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true,_true>)
      local_68 != (tuple<duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>)0x0) {
    (**(code **)(*(long *)local_68 + 0x10))();
  }
  return;
}

Assistant:

void FlushDictionary(PrimitiveColumnWriterState &state_p, ColumnWriterStatistics *stats) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();
		D_ASSERT(state.encoding == duckdb_parquet::Encoding::RLE_DICTIONARY);

		state.bloom_filter =
		    make_uniq<ParquetBloomFilter>(state.dictionary.GetSize(), writer.BloomFilterFalsePositiveRatio());

		state.dictionary.IterateValues([&](const SRC &src_value, const TGT &tgt_value) {
			// update the statistics
			OP::template HandleStats<SRC, TGT>(stats, tgt_value);
			// update the bloom filter
			auto hash = OP::template XXHash64<SRC, TGT>(tgt_value);
			state.bloom_filter->FilterInsert(hash);
		});

		// flush the dictionary page and add it to the to-be-written pages
		WriteDictionary(state, state.dictionary.GetTargetMemoryStream(), state.dictionary.GetSize());
		// bloom filter will be queued for writing in ParquetWriter::BufferBloomFilter one level up
	}